

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

void __thiscall
QItemDelegate::drawDisplay
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect,
          QString *text)

{
  QTextLayout *pQVar1;
  int iVar2;
  ColorRole CVar3;
  QItemDelegatePrivate *this_00;
  QWidget *this_01;
  uint uVar4;
  Alignment AVar5;
  QStyle *pQVar6;
  ulong uVar7;
  ulong uVar8;
  ColorRole CVar9;
  ColorRole CVar10;
  ColorGroup CVar11;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  QSizeF QVar14;
  QSize layoutSize;
  QStyleOptionViewItem opt;
  double local_1d8;
  QArrayData *local_1b8;
  char16_t *pcStack_1b0;
  double local_1a8;
  double local_1a0;
  QArrayData *local_190;
  double local_188;
  QSize local_180;
  undefined1 local_178 [12];
  Representation RStack_16c;
  QRectF local_158;
  QArrayData *local_138;
  char16_t *pcStack_130;
  qsizetype local_128;
  QRect local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CVar3 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i;
  CVar10 = Light;
  if ((CVar3 >> 0x10 & 1) != 0) {
    CVar10 = CVar3 & Button ^ Button;
  }
  CVar9 = Button;
  if ((CVar3 & Button) != WindowText) {
    CVar9 = CVar10;
  }
  this_00 = *(QItemDelegatePrivate **)&(this->super_QAbstractItemDelegate).field_0x8;
  iVar2 = (int)option;
  CVar11 = iVar2 + 0x28;
  if ((short)CVar3 < 0) {
    QPalette::brush(CVar11,CVar9);
    QPainter::fillRect((QRect *)painter,(QBrush *)rect);
  }
  QPalette::brush(CVar11,CVar9);
  QPainter::setPen((QColor *)painter);
  if ((text->d).size == 0) goto LAB_00565362;
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x400000) != 0) {
    QPainter::save();
    QPalette::brush(CVar11,CVar9);
    QPainter::setPen((QColor *)painter);
    local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)((rect->x2).m_i + -1);
    local_108.super_QStyleOption.version = (rect->x1).m_i;
    local_108.super_QStyleOption.type = (rect->y1).m_i;
    local_108.super_QStyleOption.direction = (rect->y2).m_i - RightToLeft;
    QPainter::drawRects((QRect *)painter,(int)&local_108);
    QPainter::restore();
  }
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108,option);
  this_01 = option->widget;
  if (this_01 == (QWidget *)0x0) {
    pQVar6 = QApplication::style();
  }
  else {
    pQVar6 = QWidget::style(this_01);
  }
  uVar4 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x41,0,this_01);
  local_118.x1.m_i = uVar4 + 1 + (rect->x1).m_i;
  local_118.x2.m_i = ~uVar4 + (rect->x2).m_i;
  local_118.y1.m_i = (rect->y1).m_i;
  local_118.y2.m_i = (rect->y2).m_i;
  uVar4 = (uint)(((byte)local_108.features.
                        super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                        super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 1) == 0) *
          0x200 + (*(uint *)&this_00->textOption & 0xffffe1ff) + 0x200;
  *(uint *)&this_00->textOption = uVar4;
  *(LayoutDirection *)&this_00->textOption =
       uVar4 & 0xffff27ff |
       ((option->super_QStyleOption).direction & (LayoutDirectionAuto|RightToLeft)) << 0xe;
  AVar5 = QStyle::visualAlignment
                    ((option->super_QStyleOption).direction,
                     (Alignment)
                     (option->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                     super_QFlagsStorage<Qt::AlignmentFlag>.i);
  *(uint *)&this_00->textOption =
       *(uint *)&this_00->textOption & 0xfffffe00 |
       (uint)AVar5.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1ff;
  pQVar1 = &this_00->textLayout;
  QTextLayout::setTextOption((QTextOption *)pQVar1);
  QTextLayout::setFont((QFont *)pQVar1);
  local_138 = &((text->d).d)->super_QArrayData;
  pcStack_130 = (text->d).ptr;
  local_128 = (text->d).size;
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_138->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_138->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::replace((QChar)(char16_t)&local_138,(QChar)0xa,0x2028);
  local_1a8 = (double)local_128;
  pcStack_1b0 = pcStack_130;
  local_1b8 = local_138;
  local_138 = (QArrayData *)0x0;
  pcStack_130 = (char16_t *)0x0;
  local_128 = 0;
  QTextLayout::setText((QString *)pQVar1);
  if (local_1b8 != (QArrayData *)0x0) {
    LOCK();
    (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1b8,2,0x10);
    }
  }
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,0x10);
    }
  }
  QVar14 = QItemDelegatePrivate::doTextLayout(this_00,(local_118.x2.m_i - local_118.x1.m_i) + 1);
  uVar12 = QVar14.ht._0_4_;
  uVar13 = QVar14.ht._4_4_;
  local_1d8 = QVar14.wd;
  if ((double)((local_118.x2.m_i - local_118.x1.m_i) + 1) < local_1d8) {
LAB_00564e26:
    local_1b8 = (QArrayData *)0x0;
    pcStack_1b0 = (char16_t *)0x0;
    local_1a8 = 0.0;
    local_158.yp = (qreal)(text->d).ptr;
    local_158.xp = (qreal)(text->d).size;
    uVar7 = QStringView::indexOf((QStringView *)&local_158,(QChar)0x2028,0,CaseSensitive);
    if ((int)uVar7 == -1) {
      QFontMetrics::elidedText((QString *)&local_158,iVar2 + 0x20,(int)text,option->textElideMode);
      QString::append((QString *)&local_1b8);
      if ((QArrayData *)local_158.xp != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i + -1;
        iVar2 = (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
        local_178._0_8_ = local_158.xp;
        goto joined_r0x0056507a;
      }
    }
    else {
      do {
        QString::mid((longlong)local_178,(longlong)text);
        QFontMetrics::elidedText
                  ((QString *)&local_158,iVar2 + 0x20,(int)local_178,option->textElideMode);
        QString::append((QString *)&local_1b8);
        if ((QArrayData *)local_158.xp != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_158.xp,2,0x10);
          }
        }
        if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
          }
        }
        QString::append((QChar)(char16_t)&local_1b8);
        local_158.yp = (qreal)(text->d).ptr;
        local_158.xp = (qreal)(text->d).size;
        uVar8 = QStringView::indexOf
                          ((QStringView *)&local_158,(QChar)0x2028,(long)((int)uVar7 + 1),
                           CaseSensitive);
        uVar7 = uVar8 & 0xffffffff;
      } while ((int)uVar8 != -1);
      QString::mid((longlong)local_178,(longlong)text);
      QFontMetrics::elidedText
                ((QString *)&local_158,iVar2 + 0x20,(int)local_178,option->textElideMode);
      QString::append((QString *)&local_1b8);
      if ((QArrayData *)local_158.xp != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_158.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_158.xp,2,0x10);
        }
      }
      if ((QArrayData *)local_178._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        iVar2 = (((QBasicAtomicInt *)local_178._0_8_)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
joined_r0x0056507a:
        if (iVar2 == 0) {
          QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
        }
      }
    }
    QTextLayout::setText((QString *)pQVar1);
    QVar14 = QItemDelegatePrivate::doTextLayout(this_00,(local_118.x2.m_i - local_118.x1.m_i) + 1);
    uVar12 = QVar14.ht._0_4_;
    uVar13 = QVar14.ht._4_4_;
    local_1d8 = QVar14.wd;
    if (local_1b8 != (QArrayData *)0x0) {
      LOCK();
      (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1b8,2,0x10);
      }
    }
  }
  else if ((double)((local_118.y2.m_i - local_118.y1.m_i) + 1) < QVar14.ht) goto LAB_00564e26;
  local_180.wd.m_i = (local_118.x2.m_i - local_118.x1.m_i) + 1;
  local_180.ht.m_i = (int)(double)CONCAT44(uVar13,uVar12);
  stack0xfffffffffffffe90 = &DAT_aaaaaaaaaaaaaaaa;
  local_178._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  _local_178 = QStyle::alignedRect((option->super_QStyleOption).direction,
                                   (Alignment)
                                   (option->displayAlignment).
                                   super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                   super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_180,&local_118);
  if (*(char *)(*(long *)&(this->super_QAbstractItemDelegate).field_0x8 + 0x80) == '\0') {
    if (local_1d8 <= (double)((local_118.x2.m_i - local_118.x1.m_i) + 1)) {
      if ((double)CONCAT44(uVar13,uVar12) <= (double)((local_118.y2.m_i - local_118.y1.m_i) + 1))
      goto LAB_00565156;
    }
    QPainter::save();
    QPainter::setClipRect((QRect *)painter,(ClipOperation)local_178);
    local_1b8 = (QArrayData *)(double)(int)local_178._0_4_;
    pcStack_1b0 = (char16_t *)(double)(int)local_178._4_4_;
    local_158.xp = 0.0;
    local_158.yp = 0.0;
    local_158.w = 0.0;
    local_1a8 = (double)(((long)(int)local_178._8_4_ - (long)(int)local_178._0_4_) + 1);
    local_1a0 = (double)(((long)RStack_16c.m_i - (long)(int)local_178._4_4_) + 1);
    local_190 = local_1b8;
    local_188 = (double)pcStack_1b0;
    QTextLayout::draw((QPainter *)pQVar1,(QPointF *)painter,(QList_conflict *)&local_190,&local_158)
    ;
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
              ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_158);
    QPainter::restore();
  }
  else {
LAB_00565156:
    local_1b8 = (QArrayData *)(double)(int)local_178._0_4_;
    pcStack_1b0 = (char16_t *)(double)(int)local_178._4_4_;
    local_158.xp = 0.0;
    local_158.yp = 0.0;
    local_158.w = 0.0;
    local_1a8 = (double)(((long)(int)local_178._8_4_ - (long)(int)local_178._0_4_) + 1);
    local_1a0 = (double)(((long)RStack_16c.m_i - (long)(int)local_178._4_4_) + 1);
    local_190 = local_1b8;
    local_188 = (double)pcStack_1b0;
    QTextLayout::draw((QPainter *)pQVar1,(QPointF *)painter,(QList_conflict *)&local_190,&local_158)
    ;
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
              ((QArrayDataPointer<QTextLayout::FormatRange> *)&local_158);
  }
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
LAB_00565362:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawDisplay(QPainter *painter, const QStyleOptionViewItem &option,
                                const QRect &rect, const QString &text) const
{
    Q_D(const QItemDelegate);

    QPalette::ColorGroup cg = option.state & QStyle::State_Enabled
                              ? QPalette::Normal : QPalette::Disabled;
    if (cg == QPalette::Normal && !(option.state & QStyle::State_Active))
        cg = QPalette::Inactive;
    if (option.state & QStyle::State_Selected) {
        painter->fillRect(rect, option.palette.brush(cg, QPalette::Highlight));
        painter->setPen(option.palette.color(cg, QPalette::HighlightedText));
    } else {
        painter->setPen(option.palette.color(cg, QPalette::Text));
    }

    if (text.isEmpty())
        return;

    if (option.state & QStyle::State_Editing) {
        painter->save();
        painter->setPen(option.palette.color(cg, QPalette::Text));
        painter->drawRect(rect.adjusted(0, 0, -1, -1));
        painter->restore();
    }

    const QStyleOptionViewItem opt = option;

    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    const int textMargin = style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, widget) + 1;
    QRect textRect = rect.adjusted(textMargin, 0, -textMargin, 0); // remove width padding
    const bool wrapText = opt.features & QStyleOptionViewItem::WrapText;
    d->textOption.setWrapMode(wrapText ? QTextOption::WordWrap : QTextOption::ManualWrap);
    d->textOption.setTextDirection(option.direction);
    d->textOption.setAlignment(QStyle::visualAlignment(option.direction, option.displayAlignment));
    d->textLayout.setTextOption(d->textOption);
    d->textLayout.setFont(option.font);
    d->textLayout.setText(QItemDelegatePrivate::replaceNewLine(text));

    QSizeF textLayoutSize = d->doTextLayout(textRect.width());

    if (textRect.width() < textLayoutSize.width()
        || textRect.height() < textLayoutSize.height()) {
        QString elided;
        int start = 0;
        int end = text.indexOf(QChar::LineSeparator, start);
        if (end == -1) {
            elided += option.fontMetrics.elidedText(text, option.textElideMode, textRect.width());
        } else {
            while (end != -1) {
                elided += option.fontMetrics.elidedText(text.mid(start, end - start),
                                                        option.textElideMode, textRect.width());
                elided += QChar::LineSeparator;
                start = end + 1;
                end = text.indexOf(QChar::LineSeparator, start);
            }
            //let's add the last line (after the last QChar::LineSeparator)
            elided += option.fontMetrics.elidedText(text.mid(start),
                                                    option.textElideMode, textRect.width());
        }
        d->textLayout.setText(elided);
        textLayoutSize = d->doTextLayout(textRect.width());
    }

    const QSize layoutSize(textRect.width(), int(textLayoutSize.height()));
    const QRect layoutRect = QStyle::alignedRect(option.direction, option.displayAlignment,
                                                  layoutSize, textRect);
    // if we still overflow even after eliding the text, enable clipping
    if (!hasClipping() && (textRect.width() < textLayoutSize.width()
                           || textRect.height() < textLayoutSize.height())) {
        painter->save();
        painter->setClipRect(layoutRect);
        d->textLayout.draw(painter, layoutRect.topLeft(), QList<QTextLayout::FormatRange>(),
                           layoutRect);
        painter->restore();
    } else {
        d->textLayout.draw(painter, layoutRect.topLeft(), QList<QTextLayout::FormatRange>(),
                           layoutRect);
    }
}